

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall
leveldb::log::LogTest_BadLength_Test::LogTest_BadLength_Test(LogTest_BadLength_Test *this)

{
  LogTest::LogTest(&this->super_LogTest);
  (this->super_LogTest).super_Test._vptr_Test = (_func_int **)&PTR__LogTest_0014a360;
  return;
}

Assistant:

TEST_F(LogTest, BadLength) {
  const int kPayloadSize = kBlockSize - kHeaderSize;
  Write(BigString("bar", kPayloadSize));
  Write("foo");
  // Least significant size byte is stored in header[4].
  IncrementByte(4, 1);
  ASSERT_EQ("foo", Read());
  ASSERT_EQ(kBlockSize, DroppedBytes());
  ASSERT_EQ("OK", MatchError("bad record length"));
}